

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

QVariant * __thiscall
QLineEdit::inputMethodQuery
          (QVariant *__return_storage_ptr__,QLineEdit *this,InputMethodQuery property)

{
  long lVar1;
  QVariant argument;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  argument.d.data._16_8_ = 0;
  argument.d.data._0_16_ = ZEXT816(0);
  argument.d._24_8_ = 2;
  inputMethodQuery(__return_storage_ptr__,this,property,argument);
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QLineEdit::inputMethodQuery(Qt::InputMethodQuery property) const
{
#ifdef Q_OS_ANDROID
    // QTBUG-61652
    if (property == Qt::ImEnterKeyType) {
        QWidget *next = nextInFocusChain();
        while (next && next != this && next->focusPolicy() == Qt::NoFocus)
            next = next->nextInFocusChain();
        if (next) {
            const auto nextYPos = next->mapToGlobal(QPoint(0, 0)).y();
            const auto currentYPos = mapToGlobal(QPoint(0, 0)).y();
            if (currentYPos < nextYPos)
                // Set EnterKey to KeyNext type only if the next widget
                // in the focus chain is below current QLineEdit
                return Qt::EnterKeyNext;
        }
    }
#endif
    return inputMethodQuery(property, QVariant());
}